

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O3

Gia_Man_t * Gia_ManStgKHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates,int kHot,int fVerbose)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  Vec_Vec_t *vCodes;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *p_01;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  Gia_Man_t *p_02;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  char *__file;
  char *__assertion;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int nBits;
  uint local_b4;
  void *local_a0;
  uint local_4c;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                  ,0xdd,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  vCodes = Gia_ManAssignCodes(kHot,nStates,(int *)&local_4c);
  if (vCodes->nSize != nStates) {
    __assert_fail("Vec_VecSize(vCodes) == nStates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                  ,0xe1,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  uVar18 = (ulong)local_4c;
  if (fVerbose != 0) {
    Gia_ManPrintStateEncoding(vCodes,local_4c);
  }
  p = Gia_ManStart(10000);
  pcVar5 = (char *)malloc(4);
  builtin_strncpy(pcVar5,"stg",4);
  p->pName = pcVar5;
  iVar20 = local_4c + nIns;
  if (iVar20 != 0 && SCARRY4(local_4c,nIns) == iVar20 < 0) {
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar16 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
LAB_00786474:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar6 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar6)) goto LAB_00786474;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  Gia_ManHashAlloc(p);
  uVar21 = 1 << ((byte)nIns & 0x1f);
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0x10 < uVar21) {
    uVar4 = uVar21;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar4;
  piVar7 = (int *)malloc((long)(int)uVar4 << 2);
  p_00->pArray = piVar7;
  if (nIns != 0x1f) {
    uVar4 = 1;
    if (1 < (int)uVar21) {
      uVar4 = uVar21;
    }
    uVar22 = 0;
    do {
      if (nIns < 1) {
        iVar20 = 1;
      }
      else {
        iVar20 = 1;
        iVar19 = 2;
        uVar12 = 0;
        do {
          uVar14 = uVar12 + 1;
          iVar20 = Gia_ManHashAnd(p,iVar20,iVar19 + (uint)((~uVar22 >> (uVar12 & 0x1f) & 1) != 0));
          iVar19 = iVar19 + 2;
          uVar12 = uVar14;
        } while (nIns != uVar14);
      }
      Vec_IntPush(p_00,iVar20);
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar4);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < nStates - 1U) {
    iVar20 = nStates;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar20;
  if (iVar20 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar20 << 2);
  }
  p_01->pArray = piVar7;
  if (0 < vCodes->nSize) {
    lVar15 = 0;
    do {
      pvVar8 = vCodes->pArray[lVar15];
      if (*(int *)((long)pvVar8 + 4) < 1) {
        iVar20 = 1;
      }
      else {
        iVar20 = 1;
        lVar23 = 0;
        do {
          iVar19 = *(int *)(*(long *)((long)pvVar8 + 8) + lVar23 * 4);
          if ((iVar19 < 0) || ((int)local_4c <= iVar19)) {
            __assert_fail("b >= 0 && b < nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                          ,0xfc,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
          }
          iVar13 = nIns + 1 + iVar19;
          if (iVar13 < 0) {
            __assertion = "Var >= 0 && !(c >> 1)";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
            ;
            pcVar5 = "int Abc_Var2Lit(int, int)";
            goto LAB_0078642c;
          }
          iVar20 = Gia_ManHashAnd(p,iVar20,(uint)(iVar19 < kHot) + iVar13 * 2);
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)((long)pvVar8 + 4));
      }
      Vec_IntPush(p_01,iVar20);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vCodes->nSize);
  }
  local_b4 = 8;
  if (6 < local_4c - 1) {
    local_b4 = local_4c;
  }
  if (local_b4 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)local_b4 << 3);
  }
  if (0 < (int)local_4c) {
    uVar16 = 0;
    do {
      pvVar9 = calloc(1,0x10);
      *(void **)((long)pvVar8 + uVar16 * 8) = pvVar9;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  piVar7 = (int *)malloc(0x10);
  iVar20 = 8;
  if (6 < nOuts - 1U) {
    iVar20 = nOuts;
  }
  *piVar7 = iVar20;
  if (iVar20 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)iVar20 << 3);
  }
  *(void **)(piVar7 + 2) = pvVar9;
  uVar16 = (ulong)(uint)nOuts;
  if (0 < nOuts) {
    uVar17 = 0;
    do {
      pvVar10 = calloc(1,0x10);
      *(void **)((long)pvVar9 + uVar17 * 8) = pvVar10;
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  piVar7[1] = nOuts;
  uVar4 = vLines->nSize;
  local_a0 = pvVar8;
  local_38 = uVar16;
  if ((int)uVar4 < 1) {
    local_48 = p_00->pArray;
  }
  else {
    uVar16 = 0;
    do {
      uVar22 = (uint)uVar18;
      if ((long)(int)uVar4 <= (long)(uVar16 | 1)) {
LAB_00786455:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (((ulong)uVar4 <= (uVar16 | 2)) || ((ulong)uVar4 <= (uVar16 | 3))) goto LAB_00786455;
      piVar3 = vLines->pArray;
      uVar4 = piVar3[uVar16];
      if (((int)uVar4 < 0) || ((int)uVar21 <= (int)uVar4)) {
        __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                      ,0x10b,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      uVar12 = piVar3[uVar16 | 1];
      if (((int)uVar12 < 0) || (nStates <= (int)uVar12)) {
        __assert_fail("iCur >= 0 && iCur < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                      ,0x10c,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      uVar14 = piVar3[uVar16 | 2];
      if (((int)uVar14 < 0) || (nStates <= (int)uVar14)) {
        __assert_fail("iNext >= 0 && iNext < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                      ,0x10d,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      uVar1 = piVar3[uVar16 | 3];
      if (((int)uVar1 < 0) || (1 << ((byte)nOuts & 0x1f) <= (int)uVar1)) {
        __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
                      ,0x10e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      if ((p_00->nSize <= (int)uVar4) || (p_01->nSize <= (int)uVar12)) goto LAB_00786455;
      piVar3 = p_00->pArray;
      iVar20 = Gia_ManHashAnd(p,piVar3[uVar4],p_01->pArray[uVar12]);
      if (vCodes->nSize <= (int)uVar14) {
LAB_007863f8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      pvVar10 = vCodes->pArray[uVar14];
      local_48 = piVar3;
      local_40 = uVar16;
      if (0 < *(int *)((long)pvVar10 + 4)) {
        lVar15 = 0;
        do {
          uVar4 = *(uint *)(*(long *)((long)pvVar10 + 8) + lVar15 * 4);
          iVar19 = (int)uVar18;
          if (iVar19 <= (int)uVar4) {
            uVar22 = uVar4 + 1;
            if ((int)local_b4 <= (int)uVar4) {
              local_b4 = uVar22;
              if (local_a0 == (void *)0x0) {
                local_a0 = malloc((long)(int)uVar22 << 3);
              }
              else {
                local_a0 = realloc(local_a0,(long)(int)uVar22 << 3);
              }
            }
            lVar23 = 0;
            do {
              pvVar11 = calloc(1,0x10);
              *(void **)((long)pvVar8 + lVar23 * 8 + (long)iVar19 * 8) = pvVar11;
              lVar23 = lVar23 + 1;
            } while ((uVar4 - iVar19) + 1 != (int)lVar23);
            uVar18 = (ulong)uVar22;
            uVar16 = local_40;
          }
          uVar22 = (uint)uVar18;
          if (((int)uVar4 < 0) || ((int)uVar22 <= (int)uVar4)) goto LAB_007863f8;
          Vec_IntPush(*(Vec_Int_t **)((long)pvVar8 + (ulong)uVar4 * 8),iVar20);
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)pvVar10 + 4));
      }
      if (0 < nOuts) {
        uVar18 = 0;
        do {
          if ((uVar1 >> ((uint)uVar18 & 0x1f) & 1) != 0) {
            uVar17 = (ulong)piVar7[1];
            uVar16 = uVar18 + 1;
            if ((long)uVar17 <= (long)uVar18) {
              iVar19 = (int)uVar16;
              if ((long)*piVar7 <= (long)uVar18) {
                if (*(void **)(piVar7 + 2) == (void *)0x0) {
                  pvVar10 = malloc(uVar16 * 8);
                }
                else {
                  pvVar10 = realloc(*(void **)(piVar7 + 2),uVar16 * 8);
                }
                *(void **)(piVar7 + 2) = pvVar10;
                *piVar7 = iVar19;
              }
              do {
                uVar17 = uVar17 + 1;
                pvVar10 = calloc(1,0x10);
                *(void **)((long)pvVar9 + uVar17 * 8 + -8) = pvVar10;
              } while (uVar16 != (uVar17 & 0xffffffff));
              piVar7[1] = iVar19;
              uVar17 = (ulong)iVar19;
            }
            if ((long)uVar17 <= (long)uVar18) goto LAB_007863f8;
            Vec_IntPush(*(Vec_Int_t **)((long)pvVar9 + uVar18 * 8),iVar20);
            uVar16 = local_40;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_38);
      }
      uVar16 = uVar16 + 4;
      uVar4 = vLines->nSize;
      uVar18 = (ulong)uVar22;
    } while ((int)uVar16 < (int)uVar4);
  }
  if (local_48 != (int *)0x0) {
    free(local_48);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  iVar20 = vCodes->nSize;
  if (0 < iVar20) {
    lVar15 = 0;
    do {
      pvVar8 = vCodes->pArray[lVar15];
      if (pvVar8 != (void *)0x0) {
        if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar8 + 8));
        }
        free(pvVar8);
        iVar20 = vCodes->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar20);
  }
  if (vCodes->pArray != (void **)0x0) {
    free(vCodes->pArray);
  }
  free(vCodes);
  iVar20 = piVar7[1];
  lVar15 = (long)iVar20;
  pvVar8 = *(void **)(piVar7 + 2);
  if (lVar15 < 1) {
    if (pvVar8 != (void *)0x0) goto LAB_00786300;
  }
  else {
    lVar23 = 0;
    do {
      iVar19 = Gia_ManCreateOrGate(p,*(Vec_Int_t **)((long)pvVar8 + lVar23 * 8));
      Gia_ManAppendCo(p,iVar19);
      lVar23 = lVar23 + 1;
    } while (lVar15 != lVar23);
    if (0 < iVar20) {
      lVar23 = 0;
      do {
        pvVar9 = *(void **)((long)pvVar8 + lVar23 * 8);
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        lVar23 = lVar23 + 1;
      } while (lVar15 != lVar23);
    }
LAB_00786300:
    free(pvVar8);
  }
  free(piVar7);
  if ((int)uVar18 < 1) {
    if (local_a0 == (void *)0x0) goto LAB_007863ad;
  }
  else {
    uVar16 = 0;
    do {
      uVar4 = Gia_ManCreateOrGate(p,*(Vec_Int_t **)((long)local_a0 + uVar16 * 8));
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar4 ^ (long)uVar16 < (long)kHot);
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
    if (0 < (int)uVar18) {
      uVar16 = 0;
      do {
        pvVar8 = *(void **)((long)local_a0 + uVar16 * 8);
        if (pvVar8 != (void *)0x0) {
          if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar8 + 8));
          }
          free(pvVar8);
        }
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
  }
  free(local_a0);
LAB_007863ad:
  Gia_ManSetRegNum(p,local_4c);
  Gia_ManHashStop(p);
  p_02 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  iVar20 = Gia_ManHasDangling(p_02);
  if (iVar20 == 0) {
    return p_02;
  }
  __assertion = "!Gia_ManHasDangling(p)";
  __file = "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStg.c"
  ;
  pcVar5 = "Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)";
LAB_0078642c:
  __assert_fail(__assertion,__file,0x12e,pcVar5);
}

Assistant:

Gia_Man_t * Gia_ManStgKHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates, int kHot, int fVerbose )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts, * vCodes;
    int i, b, k, nBits, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // produce state encoding
    vCodes = Gia_ManAssignCodes( kHot, nStates, &nBits );
    assert( Vec_VecSize(vCodes) == nStates );
    if ( fVerbose )
        Gia_ManPrintStateEncoding( vCodes, nBits );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nBits; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        Lit = 1;
        Vec_IntForEachEntry( vVec, b, k )
        {
            assert( b >= 0 && b < nBits );
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit(1+nIns+b, (b<kHot)) );
        }
        Vec_IntPush( vCurs, Lit );
    }

    // go through the lines
    vLitsNext = Vec_VecStart( nBits );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++);
        int iNext = Vec_IntEntry(vLines, i++);
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Vec_VecPushInt( vLitsNext, iNext, LitC );
        vVec = (Vec_Int_t *)Vec_VecEntryInt( vCodes, iNext );
        Vec_IntForEachEntry( vVec, b, k )
            Vec_VecPushInt( vLitsNext, b, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
                Vec_VecPushInt( vLitsOuts, b, LitC );
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );
    Vec_VecFree( vCodes );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, b )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, b )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), (b<kHot) ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nBits );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}